

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::~IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x50 = 0x8ab3c0
  ;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).super_IfcLightSource.field_0x38 = 0x8ab438;
  this[-1].super_IfcLightSourcePositional.super_IfcLightSource.AmbientIntensity.ptr =
       4.49106857827243e-317;
  this[-1].super_IfcLightSourcePositional.super_IfcLightSource.Intensity.ptr = 4.49108834089826e-317
  ;
  puVar1 = *(undefined1 **)&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x80;
  if (puVar1 != &this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x90) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x50);
  return;
}

Assistant:

IfcLightSourceSpot() : Object("IfcLightSourceSpot") {}